

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O2

void __thiscall
HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableTest(HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *this)

{
  Hasher local_38;
  Hasher local_2c;
  allocator_type local_20;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HashtableTest_00bb7808;
  local_2c.id_ = 0;
  local_2c.num_hashes_ = 0;
  local_2c.num_compares_ = 0;
  local_38.id_ = 0;
  local_38.num_hashes_ = 0;
  local_38.num_compares_ = 0;
  local_20.id_ = 0;
  local_20.count_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&this->ht_,0,(hasher *)&local_2c,(key_equal *)&local_38,&local_20);
  return;
}

Assistant:

HashtableTest() : ht_() {}